

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O2

ares_status_t ares_array_move(ares_array_t *arr,size_t dest_idx,size_t src_idx)

{
  ulong uVar1;
  size_t sVar2;
  ares_status_t aVar3;
  
  uVar1 = arr->alloc_cnt;
  aVar3 = ARES_EFORMERR;
  if (src_idx < uVar1 && dest_idx < uVar1) {
    if (dest_idx == src_idx) {
      return ARES_SUCCESS;
    }
    sVar2 = arr->member_size;
    if ((dest_idx < src_idx || dest_idx - src_idx == 0) ||
       ((dest_idx - src_idx) + arr->cnt <= uVar1)) {
      memmove((void *)(dest_idx * sVar2 + (long)arr->arr),(void *)(sVar2 * src_idx + (long)arr->arr)
              ,((arr->cnt - src_idx) + arr->offset) * sVar2);
      aVar3 = ARES_SUCCESS;
    }
  }
  return aVar3;
}

Assistant:

static ares_status_t ares_array_move(ares_array_t *arr, size_t dest_idx,
                                     size_t src_idx)
{
  void       *dest_ptr;
  const void *src_ptr;
  size_t      nmembers;

  if (arr == NULL || dest_idx >= arr->alloc_cnt || src_idx >= arr->alloc_cnt) {
    return ARES_EFORMERR;
  }

  /* Nothing to do */
  if (dest_idx == src_idx) {
    return ARES_SUCCESS;
  }

  dest_ptr = (unsigned char *)arr->arr + (dest_idx * arr->member_size);
  src_ptr  = (unsigned char *)arr->arr + (src_idx * arr->member_size);

  /* Check to make sure shifting to the right won't overflow our allocation
   * boundary */
  if (dest_idx > src_idx && arr->cnt + (dest_idx - src_idx) > arr->alloc_cnt) {
    return ARES_EFORMERR;
  }

  nmembers = arr->cnt - (src_idx - arr->offset);
  memmove(dest_ptr, src_ptr, nmembers * arr->member_size);

  return ARES_SUCCESS;
}